

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O1

result_t *
ising::free_energy::square::transfer_matrix<double>::calc
          (result_t *__return_storage_ptr__,uint_t Lx,uint_t Ly,real_t Jx,real_t Jy,real_t beta,
          real_t h)

{
  uint_t uVar1;
  long lVar2;
  invalid_argument *this;
  undefined4 extraout_EDX;
  uint uVar3;
  int32_t iVar4;
  uint_t j;
  size_type sVar5;
  size_type __n;
  double __x;
  double dVar6;
  value_type_conflict vVar7;
  undefined1 auVar8 [16];
  double v_21;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  exp_number<double> res;
  self_ res_7;
  size_type local_270;
  exp_number sum;
  exp_number<double> res_6;
  exp_number sum_10;
  vector<double,_std::allocator<double>_> v;
  exp_number<double> res_5;
  vector<double,_std::allocator<double>_> v_01;
  vector<double,_std::allocator<double>_> v_10;
  vector<double,_std::allocator<double>_> v_02;
  vector<double,_std::allocator<double>_> v_20;
  vector<double,_std::allocator<double>_> diag_02;
  vector<double,_std::allocator<double>_> diag_01;
  vector<double,_std::allocator<double>_> diag_20;
  vector<double,_std::allocator<double>_> diag_10;
  exp_number sum_02;
  exp_number sum_01;
  exp_number sum_20;
  vector<double,_std::allocator<double>_> vt;
  vector<double,_std::allocator<double>_> diag;
  exp_number<double> res_11;
  exp_number<double> res_13;
  exp_number<double> res_15;
  exp_number<double> res_16;
  exp_number<double> res_9;
  exp_number<double> res_10;
  exp_number local_50;
  exp_number local_40;
  
  if ((Lx == 0) || (Ly == 0)) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Lx and Ly should be positive");
  }
  else {
    if (0.0 < beta) {
      __n = (size_type)(1 << ((byte)Ly & 0x1f));
      std::vector<double,_std::allocator<double>_>::vector(&diag,__n,(allocator_type *)&diag_10);
      std::vector<double,_std::allocator<double>_>::vector(&diag_10,__n,(allocator_type *)&diag_20);
      std::vector<double,_std::allocator<double>_>::vector(&diag_20,__n,(allocator_type *)&diag_01);
      std::vector<double,_std::allocator<double>_>::vector(&diag_01,__n,(allocator_type *)&diag_02);
      std::vector<double,_std::allocator<double>_>::vector(&diag_02,__n,(allocator_type *)&v);
      fill_D(Ly,Jy,beta,h,&diag,&diag_10,&diag_20,&diag_01,&diag_02);
      sum.sign_ = 0;
      sum.log_ = 0.0;
      sum_10.sign_ = 0;
      sum_10.log_ = 0.0;
      sum_20.sign_ = 0;
      sum_20.log_ = 0.0;
      sum_01.sign_ = 0;
      sum_01.log_ = 0.0;
      sum_02.sign_ = 0;
      sum_02.log_ = 0.0;
      std::vector<double,_std::allocator<double>_>::vector(&v,__n,(allocator_type *)&v_10);
      std::vector<double,_std::allocator<double>_>::vector(&v_10,__n,(allocator_type *)&v_20);
      std::vector<double,_std::allocator<double>_>::vector(&v_20,__n,(allocator_type *)&v_01);
      std::vector<double,_std::allocator<double>_>::vector(&v_01,__n,(allocator_type *)&v_02);
      std::vector<double,_std::allocator<double>_>::vector(&v_02,__n,(allocator_type *)&vt);
      std::vector<double,_std::allocator<double>_>::vector(&vt,__n,(allocator_type *)&res_7);
      local_270 = 0;
      do {
        sVar5 = 0;
        do {
          v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar5] = 0.0;
          v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar5] = 0.0;
          v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar5] = 0.0;
          v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar5] = 0.0;
          v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar5] = 0.0;
          sVar5 = sVar5 + 1;
        } while (__n != sVar5);
        v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[local_270] = 1.0;
        if (Lx == 0) {
          vVar7 = 0.0;
          iVar4 = 1;
        }
        else {
          uVar1 = Lx;
          vVar7 = 0.0;
          iVar4 = 1;
          do {
            local_40.log_ = vVar7;
            local_40.sign_ = iVar4;
            product_D((transfer_matrix<double> *)&res_7,&diag,&diag_10,&diag_20,&diag_01,&diag_02,
                      &local_40,&v,&v_10,&v_20,&v_01,&v_02);
            local_50.log_ = res_7.log_;
            local_50.sign_ = res_7.sign_;
            product_U((transfer_matrix<double> *)&res_7,Ly,Jx,beta,&local_50,&v,&v_10,&v_20,&v_01,
                      &v_02,&vt);
            uVar1 = uVar1 - 1;
            vVar7 = res_7.log_;
            iVar4 = res_7.sign_;
          } while (uVar1 != 0);
        }
        res.log_ = vVar7;
        res.sign_ = iVar4;
        standards::exp_number<double>::exp_number
                  (&res_7,v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_270]);
        res.log_ = res.log_ + res_7.log_;
        res.sign_ = res.sign_ * res_7.sign_;
        if (ABS(res.log_ / res_7.log_) < 1e-10) {
          res.log_ = 0.0;
        }
        standards::exp_number<double>::operator+=(&sum,&res);
        res.log_ = vVar7;
        res.sign_ = iVar4;
        standards::exp_number<double>::exp_number
                  (&res_7,v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_270]);
        res.log_ = res.log_ + res_7.log_;
        res.sign_ = res.sign_ * res_7.sign_;
        if (ABS(res.log_ / res_7.log_) < 1e-10) {
          res.log_ = 0.0;
        }
        standards::exp_number<double>::operator+=(&sum_10,&res);
        res.log_ = vVar7;
        res.sign_ = iVar4;
        standards::exp_number<double>::exp_number
                  (&res_7,v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_270]);
        res.log_ = res.log_ + res_7.log_;
        res.sign_ = res.sign_ * res_7.sign_;
        if (ABS(res.log_ / res_7.log_) < 1e-10) {
          res.log_ = 0.0;
        }
        standards::exp_number<double>::operator+=(&sum_20,&res);
        res.log_ = vVar7;
        res.sign_ = iVar4;
        standards::exp_number<double>::exp_number
                  (&res_7,v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_270]);
        res.log_ = res.log_ + res_7.log_;
        res.sign_ = res.sign_ * res_7.sign_;
        if (ABS(res.log_ / res_7.log_) < 1e-10) {
          res.log_ = 0.0;
        }
        standards::exp_number<double>::operator+=(&sum_01,&res);
        res.log_ = vVar7;
        res.sign_ = iVar4;
        standards::exp_number<double>::exp_number
                  (&res_7,v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[local_270]);
        res.log_ = res.log_ + res_7.log_;
        res.sign_ = res.sign_ * res_7.sign_;
        if (ABS(res.log_ / res_7.log_) < 1e-10) {
          res.log_ = 0.0;
        }
        standards::exp_number<double>::operator+=(&sum_02,&res);
        local_270 = local_270 + 1;
      } while (local_270 != __n);
      dVar6 = standards::exp_number<double>::log(&sum,__x);
      lVar2 = Ly * Lx;
      auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar10._0_8_ = lVar2;
      auVar10._12_4_ = 0x45300000;
      v_21 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * beta;
      __return_storage_ptr__->derivatives_[0][0] = -dVar6 / v_21;
      dVar6 = standards::exp_number<double>::log(&sum,-dVar6 / v_21);
      res_5.log_ = sum_10.log_;
      res_5.sign_ = sum_10.sign_;
      standards::exp_number<double>::operator/=(&res_5,&sum);
      standards::exp_number<double>::exp_number(&res_6,dVar6 / beta);
      res_7.log_ = res_5.log_;
      res_7.sign_ = -res_5.sign_;
      standards::exp_number<double>::operator+=(&res_6,&res_7);
      res.log_ = res_6.log_;
      res.sign_ = res_6.sign_;
      standards::exp_number<double>::exp_number(&res_7,v_21);
      standards::exp_number<double>::operator/=(&res,&res_7);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&res);
      __return_storage_ptr__->derivatives_[1][0] = vVar7;
      dVar6 = standards::exp_number<double>::log(&sum,vVar7);
      res_9.log_ = sum_10.log_;
      res_9.sign_ = sum_10.sign_;
      standards::exp_number<double>::operator/=(&res_9,&sum);
      res_10.log_ = res_9.log_;
      res_10.sign_ = res_9.sign_;
      standards::exp_number<double>::exp_number(&res_7,beta);
      standards::exp_number<double>::operator/=(&res_10,&res_7);
      res_11.sign_ = res_10.sign_;
      res_11.log_ = res_10.log_ + 0.6931471805599453;
      if (ABS(res_11.log_ / 0.6931471805599453) < 1e-10) {
        res_11.log_ = 0.0;
      }
      standards::exp_number<double>::exp_number(&res_5,((dVar6 * -2.0) / beta) / beta);
      standards::exp_number<double>::operator+=(&res_5,&res_11);
      auVar8._8_8_ = sum.log_;
      auVar8._0_8_ = sum_10.log_;
      auVar9._8_8_ = sum_20.log_ + sum.log_;
      auVar9._0_8_ = sum_10.log_ + sum_10.log_;
      auVar10 = divpd(auVar9,auVar8);
      auVar11._8_8_ = -(ulong)(ABS(auVar10._8_8_) < 1e-10);
      auVar11._0_8_ = -(ulong)(ABS(auVar10._0_8_) < 1e-10);
      uVar3 = movmskpd(extraout_EDX,auVar11);
      res_13.log_ = 0.0;
      if ((uVar3 & 2) == 0) {
        res_13.log_ = sum_20.log_ + sum.log_;
      }
      res_13.sign_ = sum.sign_ * sum_20.sign_;
      res_7.log_ = 0.0;
      if ((uVar3 & 1) == 0) {
        res_7.log_ = sum_10.log_ + sum_10.log_;
      }
      res_7.sign_ = -(sum_10.sign_ * sum_10.sign_);
      standards::exp_number<double>::operator+=(&res_13,&res_7);
      res_15.log_ = res_13.log_;
      res_15.sign_ = res_13.sign_;
      standards::exp_number<double>::operator/=(&res_15,&sum);
      res_16.log_ = res_15.log_;
      res_16.sign_ = res_15.sign_;
      standards::exp_number<double>::operator/=(&res_16,&sum);
      res_6.log_ = res_5.log_;
      res_6.sign_ = res_5.sign_;
      res_7.log_ = res_16.log_;
      res_7.sign_ = -res_16.sign_;
      standards::exp_number<double>::operator+=(&res_6,&res_7);
      res.log_ = res_6.log_;
      res.sign_ = res_6.sign_;
      standards::exp_number<double>::exp_number(&res_7,v_21);
      standards::exp_number<double>::operator/=(&res,&res_7);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&res);
      __return_storage_ptr__->derivatives_[2][0] = vVar7;
      res_6.sign_ = -sum_01.sign_;
      res_6.log_ = sum_01.log_;
      standards::exp_number<double>::operator/=(&res_6,&sum);
      res.log_ = res_6.log_;
      res.sign_ = res_6.sign_;
      standards::exp_number<double>::exp_number(&res_7,v_21);
      standards::exp_number<double>::operator/=(&res,&res_7);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&res);
      __return_storage_ptr__->derivatives_[0][1] = vVar7;
      res_6.sign_ = -sum_02.sign_;
      res_6.log_ = sum_02.log_;
      standards::exp_number<double>::operator/=(&res_6,&sum);
      res.log_ = res_6.log_;
      res.sign_ = res_6.sign_;
      standards::exp_number<double>::exp_number(&res_7,v_21);
      standards::exp_number<double>::operator/=(&res,&res_7);
      vVar7 = standards::exp_number::operator_cast_to_double((exp_number *)&res);
      __return_storage_ptr__->derivatives_[0][2] = vVar7;
      if (vt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)v_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)v_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)v_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)v_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (diag_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(diag_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)diag_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)diag_02.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (diag_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(diag_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)diag_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)diag_01.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (diag_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(diag_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)diag_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)diag_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (diag_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(diag_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)diag_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)diag_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"beta should be positive");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static result_t calc(uint_t Lx, uint_t Ly, real_t Jx, real_t Jy, real_t beta,
                       real_t h) {
    if (Lx == 0 || Ly == 0)
      throw(std::invalid_argument("Lx and Ly should be positive"));
    if (beta <= 0)
      throw(std::invalid_argument("beta should be positive"));
    uint_t dim = 1 << Ly;

    std::vector<real_t> diag(dim), diag_10(dim), diag_20(dim), diag_01(dim),
        diag_02(dim);
    fill_D(Ly, Jy, beta, h, diag, diag_10, diag_20, diag_01, diag_02);

    result_t res;
    exp_number sum = 0;
    exp_number sum_10 = 0;
    exp_number sum_20 = 0;
    exp_number sum_01 = 0;
    exp_number sum_02 = 0;
    std::vector<real_t> v(dim), v_10(dim), v_20(dim), v_01(dim), v_02(dim),
        vt(dim);
    for (uint_t i = 0; i < dim; ++i) {
      exp_number factor = 1;
      for (uint_t j = 0; j < dim; ++j) {
        v[j] = 0;
        v_10[j] = 0;
        v_20[j] = 0;
        v_01[j] = 0;
        v_02[j] = 0;
      }
      v[i] = 1;
      for (uint_t x = 0; x < Lx; ++x) {
        factor = transfer_matrix<real_t>::product_D(diag, diag_10, diag_20,
                                                    diag_01, diag_02, factor, v,
                                                    v_10, v_20, v_01, v_02);
        factor = transfer_matrix<real_t>::product_U(Ly, Jx, beta, factor, v,
                                                    v_10, v_20, v_01, v_02, vt);
      }
      sum += factor * v[i];
      sum_10 += factor * v_10[i];
      sum_20 += factor * v_20[i];
      sum_01 += factor * v_01[i];
      sum_02 += factor * v_02[i];
    }
    res.set(0, 0, -log(sum) / (Lx * Ly * beta));
    res.set(1, 0, ((log(sum) / beta) - (sum_10 / sum)) / (Lx * Ly * beta));
    res.set(2, 0,
            (-(2 * log(sum) / beta / beta) + 2 * (sum_10 / sum / beta) -
             ((sum_20 * sum - sum_10 * sum_10) / sum / sum)) /
                (Lx * Ly * beta));
    res.set(0, 1, -sum_01 / sum / (Lx * Ly * beta));
    res.set(0, 2, -sum_02 / sum / (Lx * Ly * beta));
    return res;
  }